

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::inverse(Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  Matrix44<float> *pMVar5;
  Matrix44<float> *pMVar6;
  int i;
  long lVar7;
  int j;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar13;
  undefined1 auVar12 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Matrix44<float> local_48;
  
  pMVar5 = &local_48;
  pMVar6 = &local_48;
  if ((((this->x[0][3] != 0.0) || (fVar14 = this->x[1][3], fVar14 != 0.0)) || (NAN(fVar14))) ||
     (((fVar14 = this->x[2][3], fVar14 != 0.0 || (NAN(fVar14))) ||
      ((fVar14 = this->x[3][3], fVar14 != 1.0 || (NAN(fVar14))))))) {
    gjInverse(__return_storage_ptr__,this);
  }
  else {
    fVar14 = this->x[1][1];
    fVar10 = this->x[1][2];
    fVar11 = this->x[0][2];
    fVar15 = this->x[0][0];
    fVar1 = this->x[0][1];
    fVar2 = this->x[2][0];
    fVar3 = this->x[1][0];
    uVar4 = *(undefined8 *)(this->x[2] + 1);
    fVar16 = (float)uVar4;
    fVar17 = (float)((ulong)uVar4 >> 0x20);
    local_48.x[0][0] = fVar14 * fVar17 - fVar10 * fVar16;
    local_48.x[1][0] = fVar2 * fVar10 - fVar17 * fVar3;
    local_48.x[0][1] = fVar11 * fVar16 - fVar17 * fVar1;
    local_48.x[0][2] = fVar1 * fVar10 - fVar11 * fVar14;
    local_48.x[0][3] = 0.0;
    local_48.x[1][1] = fVar17 * fVar15 - fVar11 * fVar2;
    local_48.x[1][2] = fVar11 * fVar3 - fVar10 * fVar15;
    local_48.x[1][3] = 0.0;
    fVar9 = fVar3 * fVar16 - fVar14 * fVar2;
    fVar13 = fVar2 * fVar1 - fVar16 * fVar15;
    local_48.x[2][0] = fVar9;
    local_48.x[2][1] = fVar13;
    local_48.x[2][2] = fVar15 * fVar14 - fVar1 * fVar3;
    local_48.x[2][3] = 0.0;
    local_48.x[3][0] = 0.0;
    local_48.x[3][1] = 0.0;
    local_48.x[3][2] = 0.0;
    local_48.x[3][3] = 1.0;
    fVar10 = fVar9 * fVar11 + local_48.x[0][0] * fVar15 + local_48.x[1][0] * fVar1;
    fVar14 = fVar10;
    if (fVar10 <= -fVar10) {
      fVar14 = -fVar10;
    }
    if (1.0 <= fVar14) {
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          *(float *)((long)pMVar6 + lVar8 * 4) = *(float *)((long)pMVar6 + lVar8 * 4) / fVar10;
        }
        pMVar6 = (Matrix44<float> *)((long)pMVar6 + 0x10);
      }
    }
    else {
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          fVar11 = *(float *)((long)pMVar5 + lVar8 * 4);
          fVar15 = fVar11;
          if (fVar11 <= -fVar11) {
            fVar15 = -fVar11;
          }
          if (fVar14 * 8.507059e+37 <= fVar15) {
            __return_storage_ptr__->x[0][0] = 1.0;
            auVar12._0_12_ = ZEXT812(0);
            auVar12._12_4_ = 0;
            *(undefined1 (*) [16])(__return_storage_ptr__->x[0] + 1) = auVar12;
            __return_storage_ptr__->x[1][1] = 1.0;
            *(undefined1 (*) [16])(__return_storage_ptr__->x[1] + 2) = auVar12;
            __return_storage_ptr__->x[2][2] = 1.0;
            *(undefined1 (*) [16])(__return_storage_ptr__->x[2] + 3) = auVar12;
            __return_storage_ptr__->x[3][3] = 1.0;
            return __return_storage_ptr__;
          }
          *(float *)((long)pMVar5 + lVar8 * 4) = fVar11 / fVar10;
        }
        pMVar5 = (Matrix44<float> *)((long)pMVar5 + 0x10);
      }
    }
    fVar11 = (float)((uint)this->x[3][0] ^ (uint)DAT_001f84b0);
    fVar14 = this->x[3][1];
    fVar10 = this->x[3][2];
    local_48.x[3][0] =
         (fVar11 * local_48.x[0][0] - local_48.x[1][0] * fVar14) - fVar10 * local_48.x[2][0];
    local_48.x[3][1] =
         (fVar11 * local_48.x[0][1] - local_48.x[1][1] * fVar14) - fVar10 * local_48.x[2][1];
    local_48.x[3][2] =
         (local_48.x[0][2] * fVar11 - fVar14 * local_48.x[1][2]) - fVar10 * local_48.x[2][2];
    Matrix44(__return_storage_ptr__,&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix44<T>
                 Matrix44<T>::inverse () const IMATH_NOEXCEPT
{
    if (x[0][3] != 0 || x[1][3] != 0 || x[2][3] != 0 || x[3][3] != 1)
        return gjInverse ();

    Matrix44 s (
        x[1][1] * x[2][2] - x[2][1] * x[1][2],
        x[2][1] * x[0][2] - x[0][1] * x[2][2],
        x[0][1] * x[1][2] - x[1][1] * x[0][2],
        0,

        x[2][0] * x[1][2] - x[1][0] * x[2][2],
        x[0][0] * x[2][2] - x[2][0] * x[0][2],
        x[1][0] * x[0][2] - x[0][0] * x[1][2],
        0,

        x[1][0] * x[2][1] - x[2][0] * x[1][1],
        x[2][0] * x[0][1] - x[0][0] * x[2][1],
        x[0][0] * x[1][1] - x[1][0] * x[0][1],
        0,

        0,
        0,
        0,
        1);

    T r = x[0][0] * s.x[0][0] + x[0][1] * s.x[1][0] + x[0][2] * s.x[2][0];

    if (IMATH_INTERNAL_NAMESPACE::abs (r) >= 1)
    {
        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                s.x[i][j] /= r;
            }
        }
    }
    else
    {
        T mr =
            IMATH_INTERNAL_NAMESPACE::abs (r) / std::numeric_limits<T>::min ();

        for (int i = 0; i < 3; ++i)
        {
            for (int j = 0; j < 3; ++j)
            {
                if (mr > IMATH_INTERNAL_NAMESPACE::abs (s.x[i][j]))
                {
                    s.x[i][j] /= r;
                }
                else
                {
                    return Matrix44 ();
                }
            }
        }
    }

    s.x[3][0] =
        -x[3][0] * s.x[0][0] - x[3][1] * s.x[1][0] - x[3][2] * s.x[2][0];
    s.x[3][1] =
        -x[3][0] * s.x[0][1] - x[3][1] * s.x[1][1] - x[3][2] * s.x[2][1];
    s.x[3][2] =
        -x[3][0] * s.x[0][2] - x[3][1] * s.x[1][2] - x[3][2] * s.x[2][2];

    return s;
}